

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O0

void status_change_color_on(int *col,attr_t *attr,long old1,long old2,long new1,long new2)

{
  int iVar1;
  attr_t aVar2;
  long new2_local;
  long new1_local;
  long old2_local;
  long old1_local;
  attr_t *attr_local;
  int *col_local;
  
  iVar1 = status_change_color(old1,old2,new1,new2);
  *col = iVar1;
  if (*col != 0) {
    aVar2 = curses_color_attr(*col,0);
    *attr = aVar2;
    wattr_on(statuswin,*attr,0);
  }
  return;
}

Assistant:

static void status_change_color_on(int *col, attr_t *attr,
				   long old1, long old2, long new1, long new2)
{
    *col = status_change_color(old1, old2, new1, new2);
    if (*col) {
	*attr = curses_color_attr(*col, 0);
	wattron(statuswin, *attr);
    }
}